

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O0

void __thiscall CSHA256::Finalize(CSHA256 *this,uchar *hash)

{
  size_t in_RDI;
  long in_FS_OFFSET;
  uchar sizedesc [8];
  undefined4 in_stack_ffffffffffffffc8;
  uint32_t in_stack_ffffffffffffffcc;
  uchar *ptr;
  uchar *in_stack_fffffffffffffff0;
  CSHA256 *this_00;
  
  this_00 = *(CSHA256 **)(in_FS_OFFSET + 0x28);
  ptr = &stack0xfffffffffffffff0;
  WriteBE64(ptr,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  Write(this_00,in_stack_fffffffffffffff0,in_RDI);
  Write(this_00,in_stack_fffffffffffffff0,in_RDI);
  WriteBE32(ptr,in_stack_ffffffffffffffcc);
  WriteBE32(ptr,in_stack_ffffffffffffffcc);
  WriteBE32(ptr,in_stack_ffffffffffffffcc);
  WriteBE32(ptr,in_stack_ffffffffffffffcc);
  WriteBE32(ptr,in_stack_ffffffffffffffcc);
  WriteBE32(ptr,in_stack_ffffffffffffffcc);
  WriteBE32(ptr,in_stack_ffffffffffffffcc);
  WriteBE32(ptr,in_stack_ffffffffffffffcc);
  if (*(CSHA256 **)(in_FS_OFFSET + 0x28) == this_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CSHA256::Finalize(unsigned char hash[OUTPUT_SIZE])
{
    static const unsigned char pad[64] = {0x80};
    unsigned char sizedesc[8];
    WriteBE64(sizedesc, bytes << 3);
    Write(pad, 1 + ((119 - (bytes % 64)) % 64));
    Write(sizedesc, 8);
    WriteBE32(hash, s[0]);
    WriteBE32(hash + 4, s[1]);
    WriteBE32(hash + 8, s[2]);
    WriteBE32(hash + 12, s[3]);
    WriteBE32(hash + 16, s[4]);
    WriteBE32(hash + 20, s[5]);
    WriteBE32(hash + 24, s[6]);
    WriteBE32(hash + 28, s[7]);
}